

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lratchecker.cpp
# Opt level: O0

void __thiscall
CaDiCaL::LratChecker::add_constraint(LratChecker *this,vector<int,_std::allocator<int>_> *c)

{
  bool bVar1;
  iterator __last;
  iterator __val;
  undefined8 in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  int *lit;
  const_iterator __end1;
  const_iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  iterator in_stack_ffffffffffffffb0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffffc8;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  local_10 = in_RSI;
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0xdcbf83);
  local_18 = local_10;
  local_20._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(in_RDI);
  std::vector<int,_std::allocator<int>_>::end(in_RDI);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                             *)in_stack_ffffffffffffffb0._M_current,
                            (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                             *)in_RDI), bVar1) {
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
              (&local_20);
    __last = std::vector<int,_std::allocator<int>_>::begin(in_RDI);
    __val = std::vector<int,_std::allocator<int>_>::end(in_RDI);
    in_stack_ffffffffffffffc8 =
         std::find<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
                   (in_stack_ffffffffffffffc8,__last._M_current,__val._M_current);
    in_stack_ffffffffffffffb0 = std::vector<int,_std::allocator<int>_>::end(in_RDI);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_ffffffffffffffb0._M_current,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)in_RDI);
    if (!bVar1) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)__last._M_current,__val._M_current);
    }
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_20);
  }
  return;
}

Assistant:

void LratChecker::add_constraint (const vector<int> &c) {
  constraint.clear ();
  for (auto &lit : c) {
    assert (lit);
    if (std::find (constraint.begin (), constraint.end (), lit) !=
        constraint.end ())
      continue;
    constraint.push_back (lit);
  }
}